

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void reallocCaptureBuf(void)

{
  char *pcVar1;
  int *piVar2;
  
  if (lexerState->captureCapacity == 0xffffffffffffffff) {
    fatalerror("Cannot grow capture buffer past %zu bytes\n",0xffffffffffffffff);
  }
  if (lexerState->captureCapacity < 0x8000000000000000) {
    lexerState->captureCapacity = lexerState->captureCapacity << 1;
  }
  else {
    lexerState->captureCapacity = 0xffffffffffffffff;
  }
  pcVar1 = (char *)realloc(lexerState->captureBuf,lexerState->captureCapacity);
  lexerState->captureBuf = pcVar1;
  if (lexerState->captureBuf == (char *)0x0) {
    piVar2 = __errno_location();
    pcVar1 = strerror(*piVar2);
    fatalerror("realloc error while resizing capture buffer: %s\n",pcVar1);
  }
  return;
}

Assistant:

static void reallocCaptureBuf(void)
{
	if (lexerState->captureCapacity == SIZE_MAX)
		fatalerror("Cannot grow capture buffer past %zu bytes\n", SIZE_MAX);
	else if (lexerState->captureCapacity > SIZE_MAX / 2)
		lexerState->captureCapacity = SIZE_MAX;
	else
		lexerState->captureCapacity *= 2;
	lexerState->captureBuf = (char *)realloc(lexerState->captureBuf, lexerState->captureCapacity);
	if (!lexerState->captureBuf)
		fatalerror("realloc error while resizing capture buffer: %s\n", strerror(errno));
}